

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

Var * __thiscall jsonnet::internal::Desugarer::std(Desugarer *this)

{
  Identifier *ident;
  Var *pVVar1;
  char32_t *__s;
  allocator<char32_t> local_31;
  UString local_30;
  
  __s = L"$std";
  if (this->isStdlib != false) {
    __s = L"std";
  }
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&local_30,__s,&local_31);
  ident = id(this,&local_30);
  pVVar1 = var(this,ident);
  ::std::__cxx11::u32string::~u32string((u32string *)&local_30);
  return pVVar1;
}

Assistant:

Var *std(void)
    {
        // In most places, there is a "$std" variable inserted by
        // the desugarer. On the standard library itself there isn't,
        // so use "std" instead.
        return var(id(isStdlib ? U"std" : U"$std"));
    }